

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O1

void dgrminer::save_pattern_anomaly
               (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *edge_list,
               set<int,_std::less<int>,_std::allocator<int>_> *graph_ids,
               results_crate_anomalies *results_anomaly,bool set_of_graphs,PartialUnion *pu,
               int anomaly_id_of_explanation_pattern,double anomaly_outlierness,bool verbose)

{
  pointer *ppaVar1;
  pointer *ppaVar2;
  iterator iVar3;
  iterator __position;
  iterator iVar4;
  iterator __position_00;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar5;
  ostream *poVar6;
  size_type sVar7;
  _Base_ptr p_Var8;
  undefined7 in_register_00000009;
  ulong uVar9;
  pointer paVar10;
  long lVar11;
  _Rb_tree_header *p_Var12;
  array<int,_6UL> result_edge;
  vector<int,_std::allocator<int>_> occurrences_vector;
  set<int,_std::less<int>,_std::allocator<int>_> already_saved_node_ids;
  allocator_type local_dd;
  int local_dc;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  undefined8 local_c8;
  _Rb_tree_const_iterator<int> local_c0;
  _Base_ptr local_b8;
  size_t local_b0;
  double local_a8;
  undefined4 local_9c;
  set<int,_std::less<int>,_std::allocator<int>_> *local_98;
  vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>> *local_90;
  vector<std::array<int,6ul>,std::allocator<std::array<int,6ul>>> *local_88;
  PartialUnion *local_80;
  value_type local_78;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_9c = (undefined4)CONCAT71(in_register_00000009,set_of_graphs);
  results_anomaly->anomaly_saved_instances = results_anomaly->anomaly_saved_instances + 1;
  local_dc = anomaly_id_of_explanation_pattern;
  local_a8 = anomaly_outlierness;
  local_98 = graph_ids;
  local_80 = pu;
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ANOMALY PATTERN ",0x10);
    std::ostream::operator<<((ostream *)&std::cout,results_anomaly->anomaly_saved_instances);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", OUTLIERNESS: ",0xf);
    poVar6 = std::ostream::_M_insert<double>(local_a8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar10 = (edge_list->
            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((edge_list->super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != paVar10) {
    local_90 = (vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>> *)
               &results_anomaly->anomaly_result_nodes;
    local_88 = (vector<std::array<int,6ul>,std::allocator<std::array<int,6ul>>> *)
               &results_anomaly->anomaly_result_edges;
    lVar11 = 0;
    uVar9 = 0;
    do {
      sVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_60,
                         (key_type *)((long)paVar10->_M_elems + lVar11));
      if (sVar7 == 0) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_60,
                   (int *)((long)((edge_list->
                                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar11));
        paVar10 = (edge_list->
                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_d8._4_4_ = *(undefined4 *)((long)paVar10->_M_elems + lVar11);
        local_d8._0_4_ = results_anomaly->anomaly_saved_instances;
        uStack_d0 = (pointer)CONCAT44(*(undefined4 *)((long)paVar10->_M_elems + lVar11 + 0xc),
                                      *(undefined4 *)((long)paVar10->_M_elems + lVar11 + 8));
        iVar3._M_current =
             (results_anomaly->anomaly_result_nodes).
             super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (results_anomaly->anomaly_result_nodes).
            super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>::
          _M_realloc_insert<std::array<int,4ul>const&>(local_90,iVar3,(array<int,_4UL> *)local_d8);
        }
        else {
          *(undefined1 (*) [8])(iVar3._M_current)->_M_elems = local_d8;
          *(pointer *)((iVar3._M_current)->_M_elems + 2) = uStack_d0;
          ppaVar1 = &(results_anomaly->anomaly_result_nodes).
                     super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
      }
      sVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_60,
                         (key_type *)
                         ((long)((edge_list->
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar11 + 4)
                        );
      if (sVar7 == 0) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_60,
                   (int *)((long)((edge_list->
                                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar11 + 4
                          ));
        paVar10 = (edge_list->
                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_d8._4_4_ = *(int *)((long)paVar10->_M_elems + lVar11 + 4);
        local_d8._0_4_ = results_anomaly->anomaly_saved_instances;
        uStack_d0 = (pointer)CONCAT44(*(int *)((long)paVar10->_M_elems + lVar11 + 0x20),
                                      *(_Rb_tree_color *)((long)paVar10->_M_elems + lVar11 + 0x1c));
        iVar3._M_current =
             (results_anomaly->anomaly_result_nodes).
             super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (results_anomaly->anomaly_result_nodes).
            super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>::
          _M_realloc_insert<std::array<int,4ul>const&>(local_90,iVar3,(array<int,_4UL> *)local_d8);
        }
        else {
          *(undefined1 (*) [8])(iVar3._M_current)->_M_elems = local_d8;
          *(pointer *)((iVar3._M_current)->_M_elems + 2) = uStack_d0;
          ppaVar1 = &(results_anomaly->anomaly_result_nodes).
                     super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
      }
      paVar10 = (edge_list->
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      local_d8._4_4_ = *(undefined4 *)((long)paVar10->_M_elems + lVar11);
      local_d8._0_4_ = results_anomaly->anomaly_saved_instances;
      uStack_d0 = (pointer)CONCAT44(*(undefined4 *)((long)paVar10->_M_elems + lVar11 + 0x14),
                                    *(undefined4 *)((long)paVar10->_M_elems + lVar11 + 4));
      local_c8 = (_Base_ptr)
                 CONCAT44(*(int *)((long)paVar10->_M_elems + lVar11 + 0x18),
                          *(int *)((long)paVar10->_M_elems + lVar11 + 0x10));
      __position._M_current =
           (results_anomaly->anomaly_result_edges).
           super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (results_anomaly->anomaly_result_edges).
          super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::array<int,6ul>,std::allocator<std::array<int,6ul>>>::
        _M_realloc_insert<std::array<int,6ul>const&>
                  (local_88,__position,(array<int,_6UL> *)local_d8);
      }
      else {
        *(_Base_ptr *)((__position._M_current)->_M_elems + 4) = local_c8;
        *(undefined1 (*) [8])(__position._M_current)->_M_elems = local_d8;
        *(pointer *)((__position._M_current)->_M_elems + 2) = uStack_d0;
        ppaVar2 = &(results_anomaly->anomaly_result_edges).
                   super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar2 = *ppaVar2 + 1;
      }
      uVar9 = uVar9 + 1;
      paVar10 = (edge_list->
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x28;
    } while (uVar9 < (ulong)(((long)(edge_list->
                                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)paVar10 >> 3
                             ) * -0x3333333333333333));
  }
  iVar4._M_current =
       (results_anomaly->anomaly_id_of_anomalous_pattern).
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (results_anomaly->anomaly_id_of_anomalous_pattern).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&results_anomaly->anomaly_id_of_anomalous_pattern,
               iVar4,&results_anomaly->anomaly_saved_instances);
  }
  else {
    *iVar4._M_current = results_anomaly->anomaly_saved_instances;
    (results_anomaly->anomaly_id_of_anomalous_pattern).super__Vector_base<int,_std::allocator<int>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  psVar5 = local_98;
  iVar4._M_current =
       (results_anomaly->anomaly_id_of_explanation_pattern).
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (results_anomaly->anomaly_id_of_explanation_pattern).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)
               &results_anomaly->anomaly_id_of_explanation_pattern,iVar4,&local_dc);
  }
  else {
    *iVar4._M_current = local_dc;
    (results_anomaly->anomaly_id_of_explanation_pattern).
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         iVar4._M_current + 1;
  }
  __position_00._M_current =
       (results_anomaly->anomaly_outlierness).super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (results_anomaly->anomaly_outlierness).super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&results_anomaly->anomaly_outlierness,
               __position_00,&local_a8);
  }
  else {
    *__position_00._M_current = local_a8;
    (results_anomaly->anomaly_outlierness).super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position_00._M_current + 1;
  }
  if ((char)local_9c == '\0') {
    local_d8 = (undefined1  [8])0x0;
    uStack_d0 = (pointer)0x0;
    local_c8 = (_Base_ptr)0x0;
    std::__copy_move<false,false,std::bidirectional_iterator_tag>::
    __copy_m<std::_Rb_tree_const_iterator<int>,std::back_insert_iterator<std::vector<int,std::allocator<int>>>>
              ((psVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<int>)&(psVar5->_M_t)._M_impl.super__Rb_tree_header,
               (vector<int,_std::allocator<int>_> *)local_d8);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&results_anomaly->anomaly_occurrences,(value_type *)local_d8);
    if (local_d8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_d8);
    }
  }
  else {
    uStack_d0 = (pointer)((ulong)uStack_d0 & 0xffffffff00000000);
    local_c8 = (_Base_ptr)0x0;
    local_b0 = 0;
    p_Var8 = (psVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var12 = &(psVar5->_M_t)._M_impl.super__Rb_tree_header;
    local_c0._M_node = (_Base_ptr)&uStack_d0;
    local_b8 = (_Base_ptr)&uStack_d0;
    if ((_Rb_tree_header *)p_Var8 != p_Var12) {
      do {
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = PartialUnion::queryMappingSnapshotsToGraphs(local_80,p_Var8[1]._M_color);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>
                  ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   local_d8,(int *)&local_78);
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != p_Var12);
    }
    std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
              ((vector<int,std::allocator<int>> *)&local_78,local_c0,(_Base_ptr)&uStack_d0,&local_dd
              );
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&results_anomaly->anomaly_occurrences,&local_78);
    if ((void *)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         (int)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)local_78.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start));
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_d8);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return;
}

Assistant:

void save_pattern_anomaly(std::vector<std::array<int, PAT___SIZE>> &edge_list, std::set<int> &graph_ids,
                              results_crate_anomalies * results_anomaly, bool set_of_graphs, PartialUnion pu,
                              int anomaly_id_of_explanation_pattern, double anomaly_outlierness,
                              bool verbose = false)
	{
		results_anomaly->anomaly_saved_instances++;

        debug_println(verbose, "ANOMALY PATTERN ", results_anomaly->anomaly_saved_instances, ", OUTLIERNESS: ",
                      anomaly_outlierness);

		//anomaly_result_edges, anomaly_result_nodes
		std::set<int> already_saved_node_ids;
		for (size_t i = 0; i < edge_list.size(); i++)
		{
			if (already_saved_node_ids.count(edge_list[i][0]) == 0)
			{
				already_saved_node_ids.insert(edge_list[i][0]);
				std::array<int, 4> result_node = { results_anomaly->anomaly_saved_instances, edge_list[i][0], edge_list[i][2], edge_list[i][3] };
				results_anomaly->anomaly_result_nodes.push_back(result_node);
			}
			if (already_saved_node_ids.count(edge_list[i][1]) == 0)
			{
				already_saved_node_ids.insert(edge_list[i][1]);
				std::array<int, 4> result_node = { results_anomaly->anomaly_saved_instances, edge_list[i][1], edge_list[i][7], edge_list[i][8] };
				results_anomaly->anomaly_result_nodes.push_back(result_node);
			}

			std::array<int, 6> result_edge = { results_anomaly->anomaly_saved_instances, edge_list[i][0], edge_list[i][1], edge_list[i][5], edge_list[i][4], edge_list[i][6] };
			results_anomaly->anomaly_result_edges.push_back(result_edge);
		}


		//anomaly_id_of_anomalous_pattern
		results_anomaly->anomaly_id_of_anomalous_pattern.push_back(results_anomaly->anomaly_saved_instances);

		//anomaly_id_of_explanation_pattern
		results_anomaly->anomaly_id_of_explanation_pattern.push_back(anomaly_id_of_explanation_pattern);

		//anomaly_outlierness
		results_anomaly->anomaly_outlierness.push_back(anomaly_outlierness);

		//anomaly_occurrences
		if (set_of_graphs)
		{
			std::set<int> occurrences_set;
			for (std::set<int>::iterator it = graph_ids.begin(); it != graph_ids.end(); ++it)
				//for (int j = 0; j < graph_ids.size(); j++)
			{
				occurrences_set.insert(pu.queryMappingSnapshotsToGraphs(*it));
			}
			std::vector<int> occurrences_vector(occurrences_set.begin(), occurrences_set.end());
			results_anomaly->anomaly_occurrences.push_back(occurrences_vector);
		}
		else
		{
			std::vector<int> new_;
			std::copy(graph_ids.begin(), graph_ids.end(), std::back_inserter(new_));
			results_anomaly->anomaly_occurrences.push_back(new_);
		}

	}